

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

size_t __thiscall
google::protobuf::UnknownFieldSet::SpaceUsedExcludingSelfLong(UnknownFieldSet *this)

{
  int iVar1;
  pointer pUVar2;
  size_t sVar3;
  pointer pUVar4;
  size_t sVar5;
  int i;
  ulong uVar6;
  long lVar7;
  
  pUVar2 = (this->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar4 = (this->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pUVar2 == pUVar4) {
    sVar5 = 0;
  }
  else {
    sVar5 = (long)pUVar4 + (0x18 - (long)pUVar2);
    lVar7 = 8;
    for (uVar6 = 0; uVar6 < (ulong)((long)pUVar4 - (long)pUVar2 >> 4); uVar6 = uVar6 + 1) {
      iVar1 = *(int *)((long)pUVar2 + lVar7 + -4);
      if (iVar1 == 4) {
        sVar3 = SpaceUsedLong(*(UnknownFieldSet **)((long)&pUVar2->number_ + lVar7));
        sVar5 = sVar5 + sVar3;
      }
      else if (iVar1 == 3) {
        sVar3 = internal::StringSpaceUsedExcludingSelfLong
                          (*(string **)((long)&pUVar2->number_ + lVar7));
        sVar5 = sVar5 + sVar3 + 0x20;
      }
      pUVar2 = (this->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pUVar4 = (this->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar7 = lVar7 + 0x10;
    }
  }
  return sVar5;
}

Assistant:

size_t UnknownFieldSet::SpaceUsedExcludingSelfLong() const {
  if (fields_.empty()) return 0;

  size_t total_size = sizeof(fields_) + sizeof(UnknownField) * fields_.size();

  for (int i = 0; i < fields_.size(); i++) {
    const UnknownField& field = (fields_)[i];
    switch (field.type()) {
      case UnknownField::TYPE_LENGTH_DELIMITED:
        total_size += sizeof(*field.data_.length_delimited_.string_value) +
                      internal::StringSpaceUsedExcludingSelfLong(
                          *field.data_.length_delimited_.string_value);
        break;
      case UnknownField::TYPE_GROUP:
        total_size += field.data_.group_->SpaceUsedLong();
        break;
      default:
        break;
    }
  }
  return total_size;
}